

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::TopLevelASVkImpl::TopLevelASVkImpl
          (TopLevelASVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,TopLevelASDesc *Desc)

{
  Uint32 *Args;
  TopLevelASDesc *Args_1;
  VulkanPhysicalDevice *this_00;
  VulkanLogicalDevice *this_01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  VkBuildAccelerationStructureFlagsKHR VVar7;
  uint32_t MemoryTypeIndex;
  VkResult errorCode;
  VkDeviceSize memoryOffset;
  char *pcVar8;
  VkDeviceAddress VVar9;
  Uint64 UVar10;
  char (*in_stack_fffffffffffffea8) [3];
  VkMemoryRequirements MemReqs;
  VkAccelerationStructureGeometryKHR vkGeometry;
  VkAccelerationStructureBuildGeometryInfoKHR vkBuildInfo;
  uint32_t MaxPrimitiveCount;
  
  vkBuildInfo.pGeometries = (VkAccelerationStructureGeometryKHR *)vkBuildInfo._48_8_;
  TopLevelASBase<Diligent::EngineVkImplTraits>::TopLevelASBase
            (&this->super_TopLevelASBase<Diligent::EngineVkImplTraits>,pRefCounters,pRenderDeviceVk,
             Desc,false);
  (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
  .super_ObjectBase<Diligent::ITopLevelASVk>.super_RefCountedObject<Diligent::ITopLevelASVk>.
  super_ITopLevelASVk.super_ITopLevelAS.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00a52c50;
  this->m_DeviceAddress = 0;
  (this->m_VulkanTLAS).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  *(undefined1 (*) [16])
   &(this->m_VulkanTLAS).m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount = (undefined1  [16])0x0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>)0x0;
  *(undefined1 (*) [16])&(this->m_VulkanBuffer).m_VkObject = (undefined1  [16])0x0;
  (this->m_MemoryAllocation).UnalignedOffset = 0;
  (this->m_MemoryAllocation).Size = 0;
  this->m_MemoryAlignedOffset = 0;
  this_00 = (pRenderDeviceVk->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  this_01 = (pRenderDeviceVk->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  UVar10 = (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
           .m_Desc.CompactedSize;
  if (UVar10 == 0) {
    vkGeometry._80_16_ = (undefined1  [16])0x0;
    vkGeometry.geometry._40_16_ = (undefined1  [16])0x0;
    vkGeometry.geometry._24_16_ = (undefined1  [16])0x0;
    vkGeometry.geometry._8_16_ = (undefined1  [16])0x0;
    vkGeometry._4_12_ = SUB1612((undefined1  [16])0x0,4);
    vkGeometry.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
    vkGeometry._20_12_ = SUB1612((undefined1  [16])0x0,4);
    vkGeometry.geometryType = VK_GEOMETRY_TYPE_INSTANCES_KHR;
    vkGeometry.geometry.triangles.sType = 0x3b9d13f4;
    vkGeometry.geometry._4_4_ = 0;
    vkBuildInfo.ppGeometries = (VkAccelerationStructureGeometryKHR **)0x0;
    vkBuildInfo.scratchData = (VkDeviceOrHostAddressKHR)0x0;
    vkBuildInfo.geometryCount = 0;
    vkBuildInfo._52_4_ = 0;
    vkBuildInfo.pGeometries = (VkAccelerationStructureGeometryKHR *)0x0;
    vkBuildInfo.srcAccelerationStructure = (VkAccelerationStructureKHR)0x0;
    vkBuildInfo.dstAccelerationStructure = (VkAccelerationStructureKHR)0x0;
    vkBuildInfo.type = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
    vkBuildInfo.flags = 0;
    vkBuildInfo.mode = VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
    vkBuildInfo._28_4_ = 0;
    vkBuildInfo._4_12_ = SUB1612((undefined1  [16])0x0,4);
    vkBuildInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
    VVar7 = BuildASFlagsToVkBuildAccelerationStructureFlags
                      ((this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                       .m_Desc.Flags);
    auVar2._4_8_ = vkBuildInfo._24_8_;
    auVar2._0_4_ = VVar7;
    auVar2._12_4_ = 0;
    vkBuildInfo._16_16_ = auVar2 << 0x20;
    vkBuildInfo.pGeometries = &vkGeometry;
    vkBuildInfo.geometryCount = 1;
    MaxPrimitiveCount =
         (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
         .m_Desc.MaxInstanceCount;
    if ((pRenderDeviceVk->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
        MaxInstancesPerTLAS < MaxPrimitiveCount) {
      Args = &(this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
              .m_Desc.MaxInstanceCount;
      FormatString<char[21],unsigned_int,char[25],unsigned_int,char[3]>
                ((string *)&MemReqs,(Diligent *)"Max instance count (",(char (*) [21])Args,
                 (uint *)") exceeds device limit (",
                 (char (*) [25])
                 &(pRenderDeviceVk->
                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                  MaxInstancesPerTLAS,(uint *)0x8019c0,in_stack_fffffffffffffea8);
      DebugAssertionFailed
                ((Char *)MemReqs.size,"TopLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
                 ,0x40);
      std::__cxx11::string::~string((string *)&MemReqs);
      MaxPrimitiveCount = *Args;
    }
    MemReqs.memoryTypeBits = 0;
    MemReqs._20_4_ = 0;
    MemReqs._4_12_ = SUB1612((undefined1  [16])0x0,4);
    MemReqs.size._0_4_ = 0x3b9d1404;
    VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureBuildSizes
              (this_01,&vkBuildInfo,&MaxPrimitiveCount,
               (VkAccelerationStructureBuildSizesInfoKHR *)&MemReqs);
    UVar10 = CONCAT44(MemReqs._20_4_,MemReqs.memoryTypeBits);
    (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize =
         (ScratchBufferSizes)(ZEXT816(0) << 0x40);
  }
  Args_1 = &(this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
            .m_Desc;
  vkBuildInfo._4_12_ = SUB1612((undefined1  [16])0x0,4);
  vkBuildInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = UVar10;
  vkBuildInfo._16_16_ = auVar3 << 0x40;
  vkBuildInfo._36_12_ = SUB1612((undefined1  [16])0x0,4);
  vkBuildInfo.srcAccelerationStructure._0_4_ = 0x120000;
  vkBuildInfo.dstAccelerationStructure = (VkAccelerationStructureKHR)0x0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = vkBuildInfo.pGeometries;
  vkBuildInfo._48_16_ = auVar4 << 0x40;
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)&vkGeometry,this_01,(VkBufferCreateInfo *)&vkBuildInfo,
             (Args_1->super_DeviceObjectAttribs).Name);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(&this->m_VulkanBuffer,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)&vkGeometry
           );
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
             &vkGeometry);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            (&MemReqs,this_01,(this->m_VulkanBuffer).m_VkObject);
  MemoryTypeIndex =
       VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex(this_00,MemReqs.memoryTypeBits,1);
  if ((MemReqs.alignment ^ MemReqs.alignment - 1) <= MemReqs.alignment - 1) {
    FormatString<char[29]>((string *)&vkGeometry,(char (*) [29])"Alignment is not power of 2!");
    DebugAssertionFailed
              ((Char *)vkGeometry._0_8_,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x5b);
    std::__cxx11::string::~string((string *)&vkGeometry);
  }
  RenderDeviceVkImpl::AllocateMemory
            ((VulkanMemoryAllocation *)&vkGeometry,pRenderDeviceVk,MemReqs.size,MemReqs.alignment,
             MemoryTypeIndex,2);
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)vkGeometry._0_8_;
  (this->m_MemoryAllocation).UnalignedOffset = (VkDeviceSize)vkGeometry.pNext;
  (this->m_MemoryAllocation).Size = vkGeometry._16_8_;
  vkGeometry.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkGeometry._4_4_ = 0;
  vkGeometry.pNext = (void *)0x0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = vkGeometry.geometry._0_8_;
  vkGeometry._16_16_ = auVar1 << 0x40;
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation
            ((VulkanMemoryAllocation *)&vkGeometry);
  if ((this->m_MemoryAllocation).Page == (VulkanMemoryPage *)0x0) {
    LogError<true,char[37],char_const*,char[3]>
              (false,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x5e,(char (*) [37])"Failed to allocate memory for TLAS \'",(char **)Args_1,
               (char (*) [3])"\'.");
  }
  memoryOffset = AlignUp<unsigned_long,unsigned_long>
                           ((this->m_MemoryAllocation).UnalignedOffset,MemReqs.alignment);
  this->m_MemoryAlignedOffset = memoryOffset;
  if ((this->m_MemoryAllocation).Size <
      (MemReqs.size + memoryOffset) - (this->m_MemoryAllocation).UnalignedOffset) {
    FormatString<char[39]>
              ((string *)&vkGeometry,(char (*) [39])"Size of memory allocation is too small");
    DebugAssertionFailed
              ((Char *)vkGeometry._0_8_,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x61);
    std::__cxx11::string::~string((string *)&vkGeometry);
    memoryOffset = this->m_MemoryAlignedOffset;
  }
  errorCode = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (this_01,(this->m_VulkanBuffer).m_VkObject,
                         (((this->m_MemoryAllocation).Page)->m_VkMemory).m_VkObject,memoryOffset);
  if (errorCode != VK_SUCCESS) {
    pcVar8 = VulkanUtilities::VkResultToString(errorCode);
    vkGeometry._0_8_ = pcVar8;
    LogError<true,char[29],char[17],char_const*>
              (false,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,100,(char (*) [29])"Failed to bind buffer memory",(char (*) [17])"\nVK Error Code: "
               ,(char **)&vkGeometry);
  }
  vkGeometry.geometry._24_16_ = (undefined1  [16])0x0;
  vkGeometry._4_12_ = SUB1612((undefined1  [16])0x0,4);
  vkGeometry.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->m_VulkanBuffer).m_VkObject;
  vkGeometry._16_16_ = auVar5 << 0x40;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = UVar10;
  vkGeometry.geometry._8_16_ = auVar6 << 0x40;
  VulkanUtilities::VulkanLogicalDevice::CreateAccelStruct
            ((AccelStructWrapper *)&MaxPrimitiveCount,this_01,
             (VkAccelerationStructureCreateInfoKHR *)&vkGeometry,
             (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  operator=(&this->m_VulkanTLAS,
            (VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
             *)&MaxPrimitiveCount);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
              *)&MaxPrimitiveCount);
  VVar9 = VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress
                    (this_01,(this->m_VulkanTLAS).m_VkObject);
  this->m_DeviceAddress = VVar9;
  (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_BUILD_AS_READ;
  return;
}

Assistant:

TopLevelASVkImpl::TopLevelASVkImpl(IReferenceCounters*   pRefCounters,
                                   RenderDeviceVkImpl*   pRenderDeviceVk,
                                   const TopLevelASDesc& Desc) :
    TTopLevelASBase{pRefCounters, pRenderDeviceVk, Desc}
{
    const auto& LogicalDevice   = pRenderDeviceVk->GetLogicalDevice();
    const auto& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    const auto& RTProps         = pRenderDeviceVk->GetAdapterInfo().RayTracing;
    auto        AccelStructSize = m_Desc.CompactedSize;

    if (AccelStructSize == 0)
    {
        VkAccelerationStructureGeometryKHR vkGeometry{};
        vkGeometry.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
        vkGeometry.geometryType = VK_GEOMETRY_TYPE_INSTANCES_KHR;

        VkAccelerationStructureGeometryInstancesDataKHR& vkInstances{vkGeometry.geometry.instances};
        vkInstances.sType           = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_INSTANCES_DATA_KHR;
        vkInstances.arrayOfPointers = VK_FALSE;

        VkAccelerationStructureBuildGeometryInfoKHR vkBuildInfo{};
        vkBuildInfo.sType         = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
        vkBuildInfo.flags         = BuildASFlagsToVkBuildAccelerationStructureFlags(m_Desc.Flags);
        vkBuildInfo.type          = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
        vkBuildInfo.pGeometries   = &vkGeometry;
        vkBuildInfo.geometryCount = 1;

        DEV_CHECK_ERR(m_Desc.MaxInstanceCount <= RTProps.MaxInstancesPerTLAS,
                      "Max instance count (", m_Desc.MaxInstanceCount, ") exceeds device limit (", RTProps.MaxInstancesPerTLAS, ").");

        VkAccelerationStructureBuildSizesInfoKHR vkSizeInfo{};
        vkSizeInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;

        const uint32_t MaxPrimitiveCount = m_Desc.MaxInstanceCount;
        LogicalDevice.GetAccelerationStructureBuildSizes(vkBuildInfo, &MaxPrimitiveCount, vkSizeInfo);

        AccelStructSize      = vkSizeInfo.accelerationStructureSize;
        m_ScratchSize.Build  = vkSizeInfo.buildScratchSize;
        m_ScratchSize.Update = vkSizeInfo.updateScratchSize;
    }

    VkBufferCreateInfo vkBuffCI{};
    vkBuffCI.sType                 = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    vkBuffCI.flags                 = 0;
    vkBuffCI.size                  = AccelStructSize;
    vkBuffCI.usage                 = VK_BUFFER_USAGE_ACCELERATION_STRUCTURE_STORAGE_BIT_KHR | VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;
    vkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    vkBuffCI.queueFamilyIndexCount = 0;
    vkBuffCI.pQueueFamilyIndices   = nullptr;

    m_VulkanBuffer = LogicalDevice.CreateBuffer(vkBuffCI, m_Desc.Name);

    VkMemoryRequirements MemReqs         = LogicalDevice.GetBufferMemoryRequirements(m_VulkanBuffer);
    uint32_t             MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

    VERIFY(IsPowerOfTwo(MemReqs.alignment), "Alignment is not power of 2!");
    m_MemoryAllocation = pRenderDeviceVk->AllocateMemory(MemReqs.size, MemReqs.alignment, MemoryTypeIndex, VK_MEMORY_ALLOCATE_DEVICE_ADDRESS_BIT);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for TLAS '", m_Desc.Name, "'.");

    m_MemoryAlignedOffset = AlignUp(VkDeviceSize{m_MemoryAllocation.UnalignedOffset}, MemReqs.alignment);
    VERIFY(m_MemoryAllocation.Size >= MemReqs.size + (m_MemoryAlignedOffset - m_MemoryAllocation.UnalignedOffset), "Size of memory allocation is too small");
    auto Memory = m_MemoryAllocation.Page->GetVkMemory();
    auto err    = LogicalDevice.BindBufferMemory(m_VulkanBuffer, Memory, m_MemoryAlignedOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

    VkAccelerationStructureCreateInfoKHR vkAccelStrCI{};
    vkAccelStrCI.sType       = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
    vkAccelStrCI.createFlags = 0;
    vkAccelStrCI.buffer      = m_VulkanBuffer;
    vkAccelStrCI.offset      = 0;
    vkAccelStrCI.size        = AccelStructSize;
    vkAccelStrCI.type        = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;

    m_VulkanTLAS = LogicalDevice.CreateAccelStruct(vkAccelStrCI, m_Desc.Name);

    m_DeviceAddress = LogicalDevice.GetAccelerationStructureDeviceAddress(m_VulkanTLAS);

    SetState(RESOURCE_STATE_BUILD_AS_READ);
}